

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdrTsim.c
# Opt level: O0

Pdr_Set_t * Pdr_ManTernarySim(Pdr_Man_t *p,int k,Pdr_Set_t *pCube)

{
  Vec_Int_t *pVVar1;
  Vec_Int_t *vPiLits_00;
  Vec_Int_t *vCiObjs_00;
  Vec_Int_t *p_00;
  Vec_Int_t *vValues;
  Vec_Int_t *vValues_00;
  Vec_Int_t *vNodes_00;
  Vec_Int_t *p_01;
  Vec_Int_t *vVis;
  Vec_Int_t *p_02;
  Vec_Int_t *p_03;
  Aig_Man_t *pAVar2;
  FILE *pFile;
  int iVar3;
  int iVar4;
  Aig_Obj_t *pAVar5;
  int *pArray;
  Pdr_Set_t *pPVar6;
  int local_a0;
  int k_1;
  int iLit;
  int i_1;
  int RetValue;
  int Entry;
  int i;
  Aig_Obj_t *pObj;
  Vec_Int_t *vRes;
  Vec_Int_t *vCi2Rem;
  Vec_Int_t *vVisits;
  Vec_Int_t *vUndo;
  Vec_Int_t *vNodes;
  Vec_Int_t *vCoVals;
  Vec_Int_t *vCiVals;
  Vec_Int_t *vCoObjs;
  Vec_Int_t *vCiObjs;
  Vec_Int_t *vPiLits;
  Vec_Int_t *vPrio;
  Pdr_Set_t *pRes;
  Pdr_Set_t *pCube_local;
  int k_local;
  Pdr_Man_t *p_local;
  
  pVVar1 = p->vPrio;
  vPiLits_00 = p->vLits;
  vCiObjs_00 = p->vCiObjs;
  p_00 = p->vCoObjs;
  vValues = p->vCiVals;
  vValues_00 = p->vCoVals;
  vNodes_00 = p->vNodes;
  p_01 = p->vUndo;
  vVis = p->vVisits;
  p_02 = p->vCi2Rem;
  p_03 = p->vRes;
  Vec_IntClear(p_00);
  if (pCube == (Pdr_Set_t *)0x0) {
    pAVar5 = Aig_ManCo(p->pAig,p->iOutCur);
    iVar3 = Aig_ObjId(pAVar5);
    Vec_IntPush(p_00,iVar3);
  }
  else {
    for (RetValue = 0; RetValue < pCube->nLits; RetValue = RetValue + 1) {
      if (*(int *)(&pCube->field_0x14 + (long)RetValue * 4) != -1) {
        pAVar5 = Saig_ManLi(p->pAig,*(int *)(&pCube->field_0x14 + (long)RetValue * 4) >> 1);
        iVar3 = Aig_ObjId(pAVar5);
        Vec_IntPush(p_00,iVar3);
      }
    }
  }
  if (p->pPars->fVeryVerbose != 0) {
    Abc_Print(1,"Trying to justify cube ");
    pFile = _stdout;
    if (pCube == (Pdr_Set_t *)0x0) {
      Abc_Print(1,"<prop=fail>");
    }
    else {
      iVar3 = Aig_ManRegNum(p->pAig);
      Pdr_SetPrint(pFile,pCube,iVar3,(Vec_Int_t *)0x0);
    }
    Abc_Print(1," in frame %d.\n",(ulong)(uint)k);
  }
  Pdr_ManCollectCone(p->pAig,p_00,vCiObjs_00,vNodes_00);
  Pdr_ManCollectValues(p,k,vCiObjs_00,vValues);
  Pdr_ManCollectValues(p,k,p_00,vValues_00);
  if (p->pPars->fVeryVerbose != 0) {
    Pdr_ManPrintCex(p->pAig,vCiObjs_00,vValues,(Vec_Int_t *)0x0);
  }
  iVar3 = Pdr_ManSimDataInit(p->pAig,vCiObjs_00,vValues,vNodes_00,p_00,vValues_00,(Vec_Int_t *)0x0);
  if (iVar3 == 0) {
    __assert_fail("RetValue",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/pdr/pdrTsim.c"
                  ,0x195,"Pdr_Set_t *Pdr_ManTernarySim(Pdr_Man_t *, int, Pdr_Set_t *)");
  }
  if (p->pPars->fFlopPrio == 0) {
    Vec_IntClear(p_02);
    for (RetValue = 0; iVar3 = Vec_IntSize(vCiObjs_00), RetValue < iVar3; RetValue = RetValue + 1) {
      pAVar2 = p->pAig;
      iVar3 = Vec_IntEntry(vCiObjs_00,RetValue);
      pAVar5 = Aig_ManObj(pAVar2,iVar3);
      iVar3 = Saig_ObjIsLo(p->pAig,pAVar5);
      if (iVar3 != 0) {
        iVar3 = Aig_ObjCioId(pAVar5);
        iVar4 = Saig_ManPiNum(p->pAig);
        iVar3 = Vec_IntEntry(pVVar1,iVar3 - iVar4);
        if (iVar3 == 0) {
          Vec_IntClear(p_01);
          iVar3 = Pdr_ManExtendOne(p->pAig,pAVar5,p_01,vVis);
          if (iVar3 == 0) {
            Pdr_ManExtendUndo(p->pAig,p_01);
          }
          else {
            iVar3 = Aig_ObjId(pAVar5);
            Vec_IntPush(p_02,iVar3);
          }
        }
      }
    }
    for (RetValue = 0; iVar3 = Vec_IntSize(vCiObjs_00), RetValue < iVar3; RetValue = RetValue + 1) {
      pAVar2 = p->pAig;
      iVar3 = Vec_IntEntry(vCiObjs_00,RetValue);
      pAVar5 = Aig_ManObj(pAVar2,iVar3);
      iVar3 = Saig_ObjIsLo(p->pAig,pAVar5);
      if (iVar3 != 0) {
        iVar3 = Aig_ObjCioId(pAVar5);
        iVar4 = Saig_ManPiNum(p->pAig);
        iVar3 = Vec_IntEntry(pVVar1,iVar3 - iVar4);
        if (iVar3 != 0) {
          Vec_IntClear(p_01);
          iVar3 = Pdr_ManExtendOne(p->pAig,pAVar5,p_01,vVis);
          if (iVar3 == 0) {
            Pdr_ManExtendUndo(p->pAig,p_01);
          }
          else {
            iVar3 = Aig_ObjId(pAVar5);
            Vec_IntPush(p_02,iVar3);
          }
        }
      }
    }
  }
  else {
    Vec_IntClear(p_03);
    for (RetValue = 0; iVar3 = Vec_IntSize(vCiObjs_00), RetValue < iVar3; RetValue = RetValue + 1) {
      pAVar2 = p->pAig;
      iVar3 = Vec_IntEntry(vCiObjs_00,RetValue);
      pAVar5 = Aig_ManObj(pAVar2,iVar3);
      iVar3 = Saig_ObjIsLo(p->pAig,pAVar5);
      if (iVar3 != 0) {
        iVar3 = Aig_ObjCioId(pAVar5);
        iVar4 = Saig_ManPiNum(p->pAig);
        Vec_IntPush(p_03,iVar3 - iVar4);
      }
    }
    pArray = Vec_IntArray(p_03);
    iVar3 = Vec_IntSize(p_03);
    Vec_IntSelectSortCost(pArray,iVar3,pVVar1);
    Vec_IntClear(p_02);
    for (RetValue = 0; iVar3 = Vec_IntSize(p_03), RetValue < iVar3; RetValue = RetValue + 1) {
      iVar3 = Vec_IntEntry(p_03,RetValue);
      pAVar2 = p->pAig;
      iVar4 = Saig_ManPiNum(p->pAig);
      pAVar5 = Aig_ManCi(pAVar2,iVar4 + iVar3);
      iVar3 = Saig_ObjIsLo(p->pAig,pAVar5);
      if (iVar3 == 0) {
        __assert_fail("Saig_ObjIsLo( p->pAig, pObj )",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/pdr/pdrTsim.c"
                      ,0x1aa,"Pdr_Set_t *Pdr_ManTernarySim(Pdr_Man_t *, int, Pdr_Set_t *)");
      }
      Vec_IntClear(p_01);
      iVar3 = Pdr_ManExtendOne(p->pAig,pAVar5,p_01,vVis);
      if (iVar3 == 0) {
        Pdr_ManExtendUndo(p->pAig,p_01);
      }
      else {
        iVar3 = Aig_ObjId(pAVar5);
        Vec_IntPush(p_02,iVar3);
      }
    }
  }
  if (p->pPars->fVeryVerbose != 0) {
    Pdr_ManPrintCex(p->pAig,vCiObjs_00,vValues,p_02);
  }
  iVar3 = Pdr_ManSimDataInit(p->pAig,vCiObjs_00,vValues,vNodes_00,p_00,vValues_00,p_02);
  if (iVar3 != 0) {
    Pdr_ManDeriveResult(p->pAig,vCiObjs_00,vValues,p_02,p_03,vPiLits_00);
    iVar3 = Vec_IntSize(p_03);
    if (0 < iVar3) {
      if ((p->pPars->fUseAbs != 0) && (p->vAbsFlops != (Vec_Int_t *)0x0)) {
        local_a0 = 0;
        for (k_1 = 0; iVar3 = Vec_IntSize(p_03), k_1 < iVar3; k_1 = k_1 + 1) {
          iVar3 = Vec_IntEntry(p_03,k_1);
          pVVar1 = p->vAbsFlops;
          iVar4 = Abc_Lit2Var(iVar3);
          iVar4 = Vec_IntEntry(pVVar1,iVar4);
          if (iVar4 == 0) {
            iVar4 = Saig_ManPiNum(p->pAig);
            Vec_IntPush(vPiLits_00,iVar4 * 2 + iVar3);
          }
          else {
            Vec_IntWriteEntry(p_03,local_a0,iVar3);
            local_a0 = local_a0 + 1;
          }
        }
        Vec_IntShrink(p_03,local_a0);
      }
      pPVar6 = Pdr_SetCreate(p_03,vPiLits_00);
      return pPVar6;
    }
    __assert_fail("Vec_IntSize(vRes) > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/pdr/pdrTsim.c"
                  ,0x1da,"Pdr_Set_t *Pdr_ManTernarySim(Pdr_Man_t *, int, Pdr_Set_t *)");
  }
  __assert_fail("RetValue",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/pdr/pdrTsim.c"
                ,0x1d6,"Pdr_Set_t *Pdr_ManTernarySim(Pdr_Man_t *, int, Pdr_Set_t *)");
}

Assistant:

Pdr_Set_t * Pdr_ManTernarySim( Pdr_Man_t * p, int k, Pdr_Set_t * pCube )
{
    Pdr_Set_t * pRes;
    Vec_Int_t * vPrio   = p->vPrio;    // priority flops (flop indices)
    Vec_Int_t * vPiLits = p->vLits;    // array of literals (0/1 PI values)
    Vec_Int_t * vCiObjs = p->vCiObjs;  // cone leaves (CI obj IDs)
    Vec_Int_t * vCoObjs = p->vCoObjs;  // cone roots (CO obj IDs)
    Vec_Int_t * vCiVals = p->vCiVals;  // cone leaf values (0/1 CI values)
    Vec_Int_t * vCoVals = p->vCoVals;  // cone root values (0/1 CO values)
    Vec_Int_t * vNodes  = p->vNodes;   // cone nodes (node obj IDs)
    Vec_Int_t * vUndo   = p->vUndo;    // cone undos (node obj IDs)
    Vec_Int_t * vVisits = p->vVisits;  // intermediate (obj IDs)
    Vec_Int_t * vCi2Rem = p->vCi2Rem;  // CIs to be removed (CI obj IDs)
    Vec_Int_t * vRes    = p->vRes;     // final result (flop literals)
    Aig_Obj_t * pObj;
    int i, Entry, RetValue;
    //abctime clk = Abc_Clock();

    // collect CO objects
    Vec_IntClear( vCoObjs );
    if ( pCube == NULL ) // the target is the property output
    {
//        Vec_IntPush( vCoObjs, Aig_ObjId(Aig_ManCo(p->pAig, (p->pPars->iOutput==-1)?0:p->pPars->iOutput)) );
        Vec_IntPush( vCoObjs, Aig_ObjId(Aig_ManCo(p->pAig, p->iOutCur)) );
    }
    else // the target is the cube
    {
        for ( i = 0; i < pCube->nLits; i++ )
        {
            if ( pCube->Lits[i] == -1 )
                continue;
            pObj = Saig_ManLi(p->pAig, (pCube->Lits[i] >> 1));
            Vec_IntPush( vCoObjs, Aig_ObjId(pObj) );
        }
    }
if ( p->pPars->fVeryVerbose )
{
Abc_Print( 1, "Trying to justify cube " );
if ( pCube )
    Pdr_SetPrint( stdout, pCube, Aig_ManRegNum(p->pAig), NULL );
else
    Abc_Print( 1, "<prop=fail>" );
Abc_Print( 1, " in frame %d.\n", k );
}

    // collect CI objects
    Pdr_ManCollectCone( p->pAig, vCoObjs, vCiObjs, vNodes );
    // collect values
    Pdr_ManCollectValues( p, k, vCiObjs, vCiVals );
    Pdr_ManCollectValues( p, k, vCoObjs, vCoVals );
    // simulate for the first time
if ( p->pPars->fVeryVerbose )
Pdr_ManPrintCex( p->pAig, vCiObjs, vCiVals, NULL );
    RetValue = Pdr_ManSimDataInit( p->pAig, vCiObjs, vCiVals, vNodes, vCoObjs, vCoVals, NULL );
    assert( RetValue );

    // iteratively remove flops
    if ( p->pPars->fFlopPrio )
    {
        // collect flops and sort them by priority
        Vec_IntClear( vRes );
        Aig_ManForEachObjVec( vCiObjs, p->pAig, pObj, i )
        {
            if ( !Saig_ObjIsLo( p->pAig, pObj ) )
                continue;
            Entry = Aig_ObjCioId(pObj) - Saig_ManPiNum(p->pAig);
            Vec_IntPush( vRes, Entry );
        }
        Vec_IntSelectSortCost( Vec_IntArray(vRes), Vec_IntSize(vRes), vPrio );

        // try removing flops starting from low-priority to high-priority
        Vec_IntClear( vCi2Rem );
        Vec_IntForEachEntry( vRes, Entry, i )
        {
            pObj = Aig_ManCi( p->pAig, Saig_ManPiNum(p->pAig) + Entry );
            assert( Saig_ObjIsLo( p->pAig, pObj ) );
            Vec_IntClear( vUndo );
            if ( Pdr_ManExtendOne( p->pAig, pObj, vUndo, vVisits ) )
                Vec_IntPush( vCi2Rem, Aig_ObjId(pObj) );
            else
                Pdr_ManExtendUndo( p->pAig, vUndo );
        }
    }
    else
    {
        // try removing low-priority flops first
        Vec_IntClear( vCi2Rem );
        Aig_ManForEachObjVec( vCiObjs, p->pAig, pObj, i )
        {
            if ( !Saig_ObjIsLo( p->pAig, pObj ) )
                continue;
            Entry = Aig_ObjCioId(pObj) - Saig_ManPiNum(p->pAig);
            if ( Vec_IntEntry(vPrio, Entry) )
                continue;
            Vec_IntClear( vUndo );
            if ( Pdr_ManExtendOne( p->pAig, pObj, vUndo, vVisits ) )
                Vec_IntPush( vCi2Rem, Aig_ObjId(pObj) );
            else
                Pdr_ManExtendUndo( p->pAig, vUndo );
        }
        // try removing high-priority flops next
        Aig_ManForEachObjVec( vCiObjs, p->pAig, pObj, i )
        {
            if ( !Saig_ObjIsLo( p->pAig, pObj ) )
                continue;
            Entry = Aig_ObjCioId(pObj) - Saig_ManPiNum(p->pAig);
            if ( !Vec_IntEntry(vPrio, Entry) )
                continue;
            Vec_IntClear( vUndo );
            if ( Pdr_ManExtendOne( p->pAig, pObj, vUndo, vVisits ) )
                Vec_IntPush( vCi2Rem, Aig_ObjId(pObj) );
            else
                Pdr_ManExtendUndo( p->pAig, vUndo );
        }
    }

if ( p->pPars->fVeryVerbose )
Pdr_ManPrintCex( p->pAig, vCiObjs, vCiVals, vCi2Rem );
    RetValue = Pdr_ManSimDataInit( p->pAig, vCiObjs, vCiVals, vNodes, vCoObjs, vCoVals, vCi2Rem );
    assert( RetValue );

    // derive the set of resulting registers
    Pdr_ManDeriveResult( p->pAig, vCiObjs, vCiVals, vCi2Rem, vRes, vPiLits );
    assert( Vec_IntSize(vRes) > 0 );
    //p->tTsim += Abc_Clock() - clk;

    // move abstracted literals from flops to inputs
    if ( p->pPars->fUseAbs && p->vAbsFlops )
    {
        int i, iLit, k = 0;
        Vec_IntForEachEntry( vRes, iLit, i )
        {
            if ( Vec_IntEntry(p->vAbsFlops, Abc_Lit2Var(iLit)) ) // used flop
                Vec_IntWriteEntry( vRes, k++, iLit );
            else
                Vec_IntPush( vPiLits, 2*Saig_ManPiNum(p->pAig) + iLit );
        }
        Vec_IntShrink( vRes, k );
    }
    pRes = Pdr_SetCreate( vRes, vPiLits );
    //ZH: Disabled assertion because this invariant doesn't hold with down
    //because of the join operation which can bring in initial states
    //assert( k == 0 || !Pdr_SetIsInit(pRes, -1) );
    return pRes;
}